

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O0

void __thiscall PosixSerialPort::~PosixSerialPort(PosixSerialPort *this)

{
  PosixSerialPort *this_local;
  
  (this->super_SerialPort)._vptr_SerialPort = (_func_int **)&PTR__PosixSerialPort_00128c88;
  if (-1 < this->_devfd) {
    ::close(this->_devfd);
  }
  SerialPort::~SerialPort(&this->super_SerialPort);
  return;
}

Assistant:

PosixSerialPort::~PosixSerialPort()
{
    if (_devfd >= 0)
        ::close(_devfd);
}